

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O0

bool __thiscall Wasm::WasmSignature::IsEquivalent<true>(WasmSignature *this,WasmSignature *sig)

{
  WasmType *pWVar1;
  WasmType *pWVar2;
  code *pcVar3;
  bool bVar4;
  ArgSlot AVar5;
  ArgSlot AVar6;
  uint32 uVar7;
  uint32 uVar8;
  int iVar9;
  size_t sVar10;
  undefined4 *puVar11;
  WasmType **ppWVar12;
  bool bVar13;
  bool local_51;
  bool isEquivalent;
  WasmSignature *sig_local;
  WasmSignature *this_local;
  
  if (this->m_shortSig != 0xffffffffffffffff) {
    sVar10 = GetShortSig(sig);
    bVar13 = sVar10 == this->m_shortSig;
    bVar4 = IsEquivalent<false>(this,sig);
    if (bVar4 == bVar13) {
      return bVar13;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                       ,0x70,"(this->IsEquivalent<false>(sig) == isEquivalent)",
                       "this->IsEquivalent<false>(sig) == isEquivalent");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
    return bVar13;
  }
  uVar7 = GetResultCount(this);
  uVar8 = GetResultCount(sig);
  if (uVar7 != uVar8) {
    return false;
  }
  AVar5 = GetParamCount(this);
  AVar6 = GetParamCount(sig);
  if (AVar5 == AVar6) {
    AVar5 = GetParamsSize(this);
    AVar6 = GetParamsSize(sig);
    if (AVar5 != AVar6) {
      return false;
    }
    AVar5 = GetParamCount(this);
    if (AVar5 != 0) {
      ppWVar12 = Memory::WriteBarrierPtr::operator_cast_to_WasmType__
                           ((WriteBarrierPtr *)&this->m_params);
      pWVar1 = *ppWVar12;
      ppWVar12 = Memory::WriteBarrierPtr::operator_cast_to_WasmType__
                           ((WriteBarrierPtr *)&sig->m_params);
      pWVar2 = *ppWVar12;
      AVar5 = GetParamCount(this);
      iVar9 = memcmp(pWVar1,pWVar2,(ulong)AVar5 << 2);
      if (iVar9 != 0) {
        return false;
      }
    }
    uVar7 = GetResultCount(this);
    local_51 = true;
    if (uVar7 != 0) {
      ppWVar12 = Memory::WriteBarrierPtr::operator_cast_to_WasmType__
                           ((WriteBarrierPtr *)&this->m_results);
      pWVar1 = *ppWVar12;
      ppWVar12 = Memory::WriteBarrierPtr::operator_cast_to_WasmType__
                           ((WriteBarrierPtr *)&sig->m_results);
      pWVar2 = *ppWVar12;
      uVar7 = GetResultCount(this);
      iVar9 = memcmp(pWVar1,pWVar2,(ulong)uVar7 << 2);
      local_51 = iVar9 == 0;
    }
    return local_51;
  }
  return false;
}

Assistant:

bool WasmSignature::IsEquivalent(const WasmSignature* sig) const
{
    if (useShortSig && m_shortSig != Js::Constants::InvalidSignature)
    {
        bool isEquivalent = sig->GetShortSig() == m_shortSig;
        Assert(this->IsEquivalent<false>(sig) == isEquivalent);
        return isEquivalent;
    }
    if (GetResultCount() == sig->GetResultCount() &&
        GetParamCount() == sig->GetParamCount() &&
        GetParamsSize() == sig->GetParamsSize())
    {
        return (
            (GetParamCount() == 0 || memcmp(m_params, sig->m_params, GetParamCount() * sizeof(Local)) == 0) &&
            (GetResultCount() == 0 || memcmp(m_results, sig->m_results, GetResultCount() * sizeof(Local)) == 0)
        );
    }
    return false;
}